

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte bVar2;
  char_t *pcVar3;
  char_t *pcVar4;
  byte *s_00;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  pbVar1 = (byte *)s;
LAB_00123f11:
  do {
    s_00 = pbVar1;
    bVar2 = *s_00;
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) goto LAB_00123f52;
    bVar2 = s_00[1];
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
      s_00 = s_00 + 1;
      goto LAB_00123f52;
    }
    bVar2 = s_00[2];
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
      s_00 = s_00 + 2;
      goto LAB_00123f52;
    }
    bVar2 = s_00[3];
    pbVar1 = s_00 + 4;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 1) == 0);
  s_00 = s_00 + 3;
LAB_00123f52:
  if (bVar2 == 0) {
    pcVar3 = gap::flush(&local_28,(char_t *)s_00);
    goto LAB_00123f9b;
  }
  if (bVar2 != 0x3c) {
    pbVar1 = s_00 + 1;
    goto LAB_00123f11;
  }
  pcVar3 = gap::flush(&local_28,(char_t *)s_00);
  do {
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
    pcVar3 = pcVar4 + -1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar4[-1]] & 8) != 0);
  *pcVar4 = '\0';
  return (char_t *)(s_00 + 1);
  while (pcVar3 = pcVar4 + -1, ((anonymous_namespace)::chartype_table[(byte)pcVar4[-1]] & 8) != 0) {
LAB_00123f9b:
    pcVar4 = pcVar3;
    if (pcVar4 <= s) break;
  }
  *pcVar4 = '\0';
  return (char_t *)s_00;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}